

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O1

void testcursors(wins *wins_ar,int ar_len)

{
  long *plVar1;
  char cVar2;
  char *pcVar3;
  Am_Cursor happy_cursor;
  Am_Image_Array rom;
  Am_Cursor crosshair_cursor;
  Am_Image_Array crosshair_mask;
  Am_Image_Array crosshair;
  Am_Cursor borg_cursor;
  Am_Image_Array borg_mask;
  Am_Image_Array borg;
  Am_Cursor ds9_cursor;
  Am_Image_Array ds9_mask;
  Am_Image_Array ds9;
  Am_Image_Array happy_mask;
  Am_Image_Array happy;
  Am_Cursor rom_cursor;
  Am_Image_Array rom_mask;
  Am_Cursor aAStack_1a8 [8];
  Am_Image_Array local_1a0 [8];
  Am_Cursor local_198 [8];
  Am_Image_Array local_190 [8];
  Am_Image_Array local_188 [8];
  Am_Cursor local_180 [8];
  Am_Image_Array local_178 [8];
  Am_Image_Array local_170 [8];
  Am_Cursor local_168 [8];
  Am_Image_Array local_160 [8];
  Am_Image_Array local_158 [8];
  Am_Image_Array local_150 [8];
  Am_Image_Array local_148 [8];
  Am_Style local_140 [8];
  Am_Style local_138 [8];
  Am_Image_Array local_130 [8];
  Am_Image_Array local_128 [8];
  Am_Style local_120 [8];
  Am_Style local_118 [8];
  Am_Image_Array local_110 [8];
  Am_Image_Array local_108 [8];
  Am_Image_Array local_100 [8];
  Am_Image_Array local_f8 [8];
  long local_f0;
  wins *local_e8;
  long *local_e0;
  long *local_d8;
  long *local_d0;
  long *local_c8;
  long local_c0;
  Am_Cursor local_b8 [8];
  Am_Style local_b0 [8];
  Am_Image_Array local_a8 [8];
  Am_Image_Array local_a0 [8];
  Am_Cursor local_98 [8];
  Am_Image_Array local_90 [8];
  Am_Cursor local_88 [8];
  Am_Style local_80 [8];
  Am_Cursor local_78 [8];
  Am_Style local_70 [8];
  Am_Image_Array local_68 [8];
  Am_Image_Array local_60 [8];
  Am_Cursor local_58 [8];
  Am_Style local_50 [8];
  Am_Cursor local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  
  if (0 < ar_len) {
    local_f0 = (ulong)(uint)ar_len << 6;
    local_c0 = 0;
    local_e8 = wins_ar;
    do {
      plVar1 = *(long **)((long)&local_e8->d1 + local_c0);
      local_c8 = *(long **)((long)&local_e8->d2 + local_c0);
      local_d0 = *(long **)((long)&local_e8->d3 + local_c0);
      local_d8 = *(long **)((long)&local_e8->d4 + local_c0);
      local_e0 = *(long **)((long)&local_e8->d5 + local_c0);
      pcVar3 = (char *)Am_Merge_Pathname("images/happy.xbm");
      Am_Image_Array::Am_Image_Array(local_148,pcVar3);
      pcVar3 = (char *)Am_Merge_Pathname("images/happy_mask.xbm");
      Am_Image_Array::Am_Image_Array(local_150,pcVar3);
      Am_Image_Array::Am_Image_Array(local_f8,local_148);
      Am_Image_Array::Am_Image_Array(local_100,local_150);
      Am_Style::Am_Style(local_38,(Am_Style *)&Am_Purple);
      Am_Style::Am_Style(local_40,(Am_Style *)&Am_White);
      Am_Cursor::Am_Cursor(aAStack_1a8,local_f8,local_100,local_38,local_40);
      Am_Style::~Am_Style(local_40);
      Am_Style::~Am_Style(local_38);
      Am_Image_Array::~Am_Image_Array(local_100);
      Am_Image_Array::~Am_Image_Array(local_f8);
      cVar2 = Am_Cursor::Valid();
      if (cVar2 == '\0') {
        testcursors();
      }
      else {
        Am_Cursor::Am_Cursor(local_48,aAStack_1a8);
        (**(code **)(*plVar1 + 0x1c0))(plVar1,local_48);
        Am_Cursor::~Am_Cursor(local_48);
      }
      pcVar3 = (char *)Am_Merge_Pathname("images/ds9.xbm");
      Am_Image_Array::Am_Image_Array(local_158,pcVar3);
      pcVar3 = (char *)Am_Merge_Pathname("images/ds9_mask.xbm");
      Am_Image_Array::Am_Image_Array(local_160,pcVar3);
      Am_Image_Array::Am_Image_Array(local_108,local_158);
      Am_Image_Array::Am_Image_Array(local_110,local_160);
      Am_Style::Am_Style(local_118,(Am_Style *)&Am_Blue);
      Am_Style::Am_Style(local_50,(Am_Style *)&Am_White);
      Am_Cursor::Am_Cursor(local_168,local_108,local_110,local_118,local_50);
      Am_Style::~Am_Style(local_50);
      Am_Style::~Am_Style(local_118);
      Am_Image_Array::~Am_Image_Array(local_110);
      Am_Image_Array::~Am_Image_Array(local_108);
      cVar2 = Am_Cursor::Valid();
      if (cVar2 == '\0') {
        testcursors();
      }
      else {
        Am_Cursor::Am_Cursor(local_58,local_168);
        (**(code **)(*local_c8 + 0x1c0))(local_c8,local_58);
        Am_Cursor::~Am_Cursor(local_58);
      }
      pcVar3 = (char *)Am_Merge_Pathname("images/borg.xbm");
      Am_Image_Array::Am_Image_Array(local_170,pcVar3);
      pcVar3 = (char *)Am_Merge_Pathname("images/borg_mask.xbm");
      Am_Image_Array::Am_Image_Array(local_178,pcVar3);
      Am_Image_Array::Am_Image_Array(local_60,local_170);
      Am_Image_Array::Am_Image_Array(local_68,local_178);
      Am_Style::Am_Style(local_120,(Am_Style *)&Am_Red);
      Am_Style::Am_Style(local_70,(Am_Style *)&Am_White);
      Am_Cursor::Am_Cursor(local_180,local_60,local_68,local_120,local_70);
      Am_Style::~Am_Style(local_70);
      Am_Style::~Am_Style(local_120);
      Am_Image_Array::~Am_Image_Array(local_68);
      Am_Image_Array::~Am_Image_Array(local_60);
      cVar2 = Am_Cursor::Valid();
      if (cVar2 == '\0') {
        testcursors();
      }
      else {
        Am_Cursor::Am_Cursor(local_78,local_180);
        (**(code **)(*local_d0 + 0x1c0))(local_d0,local_78);
        Am_Cursor::~Am_Cursor(local_78);
      }
      pcVar3 = (char *)Am_Merge_Pathname("images/crosshair.xbm");
      Am_Image_Array::Am_Image_Array(local_188,pcVar3);
      pcVar3 = (char *)Am_Merge_Pathname("images/crosshair_mask.xbm");
      Am_Image_Array::Am_Image_Array(local_190,pcVar3);
      Am_Image_Array::Am_Image_Array(local_128,local_188);
      Am_Image_Array::Am_Image_Array(local_130,local_190);
      Am_Style::Am_Style(local_138,(Am_Style *)&Am_Black);
      Am_Style::Am_Style(local_80,(Am_Style *)&Am_White);
      Am_Cursor::Am_Cursor(local_198,local_128,local_130,local_138,local_80);
      Am_Style::~Am_Style(local_80);
      Am_Style::~Am_Style(local_138);
      Am_Image_Array::~Am_Image_Array(local_130);
      Am_Image_Array::~Am_Image_Array(local_128);
      cVar2 = Am_Cursor::Valid();
      if (cVar2 == '\0') {
        testcursors();
      }
      else {
        Am_Cursor::Am_Cursor(local_88,local_198);
        (**(code **)(*local_d8 + 0x1c0))(local_d8,local_88);
        Am_Cursor::~Am_Cursor(local_88);
      }
      pcVar3 = (char *)Am_Merge_Pathname("images/rom.xbm");
      Am_Image_Array::Am_Image_Array(local_1a0,pcVar3);
      pcVar3 = (char *)Am_Merge_Pathname("images/rom_mask.xbm");
      Am_Image_Array::Am_Image_Array(local_90,pcVar3);
      Am_Image_Array::Am_Image_Array(local_a0,local_1a0);
      Am_Image_Array::Am_Image_Array(local_a8,local_90);
      Am_Style::Am_Style(local_140,(Am_Style *)&Am_Green);
      Am_Style::Am_Style(local_b0,(Am_Style *)&Am_White);
      Am_Cursor::Am_Cursor(local_98,local_a0,local_a8,local_140,local_b0);
      Am_Style::~Am_Style(local_b0);
      Am_Style::~Am_Style(local_140);
      Am_Image_Array::~Am_Image_Array(local_a8);
      Am_Image_Array::~Am_Image_Array(local_a0);
      cVar2 = Am_Cursor::Valid();
      if (cVar2 == '\0') {
        testcursors();
      }
      else {
        Am_Cursor::Am_Cursor(local_b8,local_98);
        (**(code **)(*local_e0 + 0x1c0))(local_e0,local_b8);
        Am_Cursor::~Am_Cursor(local_b8);
      }
      Am_Cursor::~Am_Cursor(local_98);
      Am_Image_Array::~Am_Image_Array(local_90);
      Am_Image_Array::~Am_Image_Array(local_1a0);
      Am_Cursor::~Am_Cursor(local_198);
      Am_Image_Array::~Am_Image_Array(local_190);
      Am_Image_Array::~Am_Image_Array(local_188);
      Am_Cursor::~Am_Cursor(local_180);
      Am_Image_Array::~Am_Image_Array(local_178);
      Am_Image_Array::~Am_Image_Array(local_170);
      Am_Cursor::~Am_Cursor(local_168);
      Am_Image_Array::~Am_Image_Array(local_160);
      Am_Image_Array::~Am_Image_Array(local_158);
      Am_Cursor::~Am_Cursor(aAStack_1a8);
      Am_Image_Array::~Am_Image_Array(local_150);
      Am_Image_Array::~Am_Image_Array(local_148);
      local_c0 = local_c0 + 0x40;
    } while (local_f0 != local_c0);
  }
  return;
}

Assistant:

void
testcursors(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d1 = wins_ar[i].d1;
    Am_Drawonable *d2 = wins_ar[i].d2;
    Am_Drawonable *d3 = wins_ar[i].d3;
    Am_Drawonable *d4 = wins_ar[i].d4;
    Am_Drawonable *d5 = wins_ar[i].d5;

    Am_Image_Array happy(Am_Merge_Pathname(IMFN_HAPPY));
    Am_Image_Array happy_mask(Am_Merge_Pathname(IMFN_HAPPY_M));
    Am_Cursor happy_cursor(happy, happy_mask, Am_Purple, Am_White);
    if (happy_cursor.Valid())
      d1->Set_Cursor(happy_cursor);
    else
      fprintf(stderr, "happy_cursor didn't work.\n");

    Am_Image_Array ds9(Am_Merge_Pathname(IMFN_DS9));
    Am_Image_Array ds9_mask(Am_Merge_Pathname(IMFN_DS9_M));
    Am_Cursor ds9_cursor(ds9, ds9_mask, Am_Blue, Am_White);
    if (ds9_cursor.Valid())
      d2->Set_Cursor(ds9_cursor);
    else
      fprintf(stderr, "ds9_cursor didn't work.\n");

    Am_Image_Array borg(Am_Merge_Pathname(IMFN_BORG));
    Am_Image_Array borg_mask(Am_Merge_Pathname(IMFN_BORG_M));
    Am_Cursor borg_cursor(borg, borg_mask, Am_Red, Am_White);
    if (borg_cursor.Valid())
      d3->Set_Cursor(borg_cursor);
    else
      fprintf(stderr, "borg_cursor didn't work.\n");

    Am_Image_Array crosshair(Am_Merge_Pathname(IMFN_CROSSHR));
    Am_Image_Array crosshair_mask(Am_Merge_Pathname(IMFN_CROSSHR_M));
    Am_Cursor crosshair_cursor(crosshair, crosshair_mask, Am_Black, Am_White);
    if (crosshair_cursor.Valid())
      d4->Set_Cursor(crosshair_cursor);
    else
      fprintf(stderr, "crosshair_cursor didn't work.\n");

    Am_Image_Array rom(Am_Merge_Pathname(IMFN_ROM));
    Am_Image_Array rom_mask(Am_Merge_Pathname(IMFN_ROM_M));
    Am_Cursor rom_cursor(rom, rom_mask, Am_Green, Am_White);
    if (rom_cursor.Valid())
      d5->Set_Cursor(rom_cursor);
    else
      fprintf(stderr, "rom_cursor didn't work.\n");
  }
}